

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_AddMultisigSign_Test::TestBody
          (ConfidentialTransactionContext_AddMultisigSign_Test *this)

{
  bool bVar1;
  reference this_00;
  char *lhs;
  AssertionResult gtest_ar;
  ByteData der_bytes2;
  ByteData der_bytes1;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> signatures;
  uint32_t vout;
  Txid txid;
  Script redeem_script;
  ConfidentialTransactionContext ctx;
  value_type *in_stack_fffffffffffffb58;
  ConfidentialTransactionContext *in_stack_fffffffffffffb60;
  SigHashType *in_stack_fffffffffffffb88;
  allocator *paVar2;
  AddressType address_type;
  Script *redeem_script_00;
  SignParameter *this_01;
  OutPoint *outpoint;
  ConfidentialTransactionContext *this_02;
  AssertHelper local_448;
  Message local_440;
  string local_438;
  AssertionResult local_418;
  AssertHelper local_408;
  Message local_400 [2];
  OutPoint local_3f0;
  allocator local_3c1;
  string local_3c0;
  Pubkey local_3a0;
  allocator local_381;
  string local_380;
  Pubkey local_360;
  SigHashType local_344 [11];
  SigHashType local_2bc [11];
  allocator local_231;
  string local_230;
  ByteData local_210;
  Script local_1f1;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_1b8;
  uint32_t local_1a0;
  undefined1 local_199 [73];
  undefined1 local_150 [32];
  undefined1 local_130 [79];
  undefined1 local_e1 [33];
  AbstractTransaction local_c0 [12];
  
  this_02 = (ConfidentialTransactionContext *)local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_e1 + 1),
             "0200000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e0740000000000000000000000000000"
             ,(allocator *)this_02);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (in_stack_fffffffffffffb60,(string *)in_stack_fffffffffffffb58);
  std::__cxx11::string::~string((string *)(local_e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e1);
  outpoint = (OutPoint *)(local_199 + 0x48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_150,
             "522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae"
             ,(allocator *)outpoint);
  cfd::core::Script::Script((Script *)local_130,(string *)local_150);
  std::__cxx11::string::~string((string *)local_150);
  std::allocator<char>::~allocator((allocator<char> *)(local_199 + 0x48));
  this_01 = (SignParameter *)local_199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)local_199 + 1),
             "ea9d5a9e974af1d167305aa6ee598706d63274e8a40f4f33af97db37a7adde4c",(allocator *)this_01
            );
  cfd::core::Txid::Txid((Txid *)((long)local_199 + 0x21),(string *)((long)local_199 + 1));
  std::__cxx11::string::~string((string *)((long)local_199 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_199);
  local_1a0 = 0;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)0x221451);
  redeem_script_00 = &local_1f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)&local_1f1._vptr_Script + 1),
             "47ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb"
             ,(allocator *)redeem_script_00);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             ((long)&local_1f1.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1),
             (string *)((long)&local_1f1._vptr_Script + 1));
  std::__cxx11::string::~string((string *)((long)&local_1f1._vptr_Script + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  paVar2 = &local_231;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_230,
             "30440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601"
             ,paVar2);
  address_type = (AddressType)((ulong)paVar2 >> 0x20);
  cfd::core::ByteData::ByteData(&local_210,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  cfd::core::SigHashType::SigHashType(local_2bc,kSigHashAll,false,false);
  cfd::SignParameter::SignParameter
            (this_01,(ByteData *)redeem_script_00,SUB41(address_type >> 0x18,0),
             in_stack_fffffffffffffb88);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  cfd::SignParameter::~SignParameter((SignParameter *)in_stack_fffffffffffffb60);
  cfd::core::SigHashType::SigHashType(local_344,kSigHashAll,false,false);
  cfd::SignParameter::SignParameter
            (this_01,(ByteData *)redeem_script_00,SUB41(address_type >> 0x18,0),
             in_stack_fffffffffffffb88);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  cfd::SignParameter::~SignParameter((SignParameter *)in_stack_fffffffffffffb60);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::operator[](&local_1b8,0);
  paVar2 = &local_381;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_380,
             "02be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5",paVar2);
  cfd::core::Pubkey::Pubkey(&local_360,&local_380);
  cfd::SignParameter::SetRelatedPubkey
            ((SignParameter *)in_stack_fffffffffffffb60,(Pubkey *)in_stack_fffffffffffffb58);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x221645);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  this_00 = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::operator[]
                      (&local_1b8,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3c0,
             "02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef",&local_3c1);
  cfd::core::Pubkey::Pubkey(&local_3a0,&local_3c0);
  cfd::SignParameter::SetRelatedPubkey
            ((SignParameter *)in_stack_fffffffffffffb60,(Pubkey *)in_stack_fffffffffffffb58);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2216db);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3f0,(Txid *)((long)local_199 + 0x21),local_1a0);
      cfd::ConfidentialTransactionContext::AddMultisigSign
                (this_02,outpoint,
                 (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)this_01,
                 redeem_script_00,address_type);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x22177d);
    }
  }
  else {
    testing::Message::Message(local_400);
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x1d4,
               "Expected: ctx.AddMultisigSign( OutPoint(txid, vout), signatures, redeem_script, AddressType::kP2wshAddress) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_408,local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    testing::Message::~Message((Message *)0x221af4);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_438,local_c0);
  lhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_418,"ctx.GetHex().c_str()",
             "\"0200000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e074000000000000000004004730440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb0169522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae0000000000\""
             ,lhs,
             "0200000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e074000000000000000004004730440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb0169522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae0000000000"
            );
  std::__cxx11::string::~string((string *)&local_438);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_418);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    in_stack_fffffffffffffb60 =
         (ConfidentialTransactionContext *)
         testing::AssertionResult::failure_message((AssertionResult *)0x221c05);
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x1d6,(char *)in_stack_fffffffffffffb60);
    testing::internal::AssertHelper::operator=(&local_448,&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    testing::Message::~Message((Message *)0x221c53);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x221ca2);
  cfd::core::ByteData::~ByteData((ByteData *)0x221caf);
  cfd::core::ByteData::~ByteData((ByteData *)0x221cbc);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)this_00);
  cfd::core::Txid::~Txid((Txid *)0x221cd6);
  cfd::core::Script::~Script((Script *)in_stack_fffffffffffffb60);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffffb60);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddMultisigSign) {
  // P2wpkhMultisig
  ConfidentialTransactionContext ctx("0200000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e0740000000000000000000000000000");
  Script redeem_script("522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae");

  Txid txid("ea9d5a9e974af1d167305aa6ee598706d63274e8a40f4f33af97db37a7adde4c");
  uint32_t vout = 0;

  std::vector<SignParameter> signatures;
  ByteData der_bytes1("47ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb");
  ByteData der_bytes2("30440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601");
  signatures.push_back(SignParameter(der_bytes1, true));
  signatures.push_back(SignParameter(der_bytes2, false));
  signatures[0].SetRelatedPubkey(Pubkey("02be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5"));
  signatures[1].SetRelatedPubkey(Pubkey("02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef"));

  EXPECT_NO_THROW(ctx.AddMultisigSign(
      OutPoint(txid, vout), signatures, redeem_script, AddressType::kP2wshAddress));

  EXPECT_STREQ(ctx.GetHex().c_str(), "0200000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e074000000000000000004004730440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb0169522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae0000000000");
}